

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::SetUp(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
        *this)

{
  bool bVar1;
  ParamType *__src;
  uint8_t *puVar2;
  void *pvVar3;
  AssertHelper *this_00;
  SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
  *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff2c;
  AssertHelper *in_stack_ffffffffffffff30;
  uchar **in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Type type;
  AssertionResult local_80 [2];
  undefined8 local_60;
  Message *in_stack_ffffffffffffffa8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffb0;
  AssertionResult local_18;
  
  __src = testing::
          WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>_>
          ::GetParam();
  memcpy(&in_RDI->params_,__src,0x2c);
  type = (Type)((ulong)&in_RDI->rnd_ >> 0x20);
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  bVar1 = use_high_bit_depth(in_RDI);
  if (bVar1) {
    block_size(in_RDI);
    pvVar3 = aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->src_ = (uint8_t *)((ulong)pvVar3 >> 1);
    block_size(in_RDI);
    pvVar3 = aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->sec_ = (uint8_t *)((ulong)pvVar3 >> 1);
    in_stack_ffffffffffffff48 = block_size(in_RDI);
    in_stack_ffffffffffffff4c = width(in_RDI);
    in_stack_ffffffffffffff4c = in_stack_ffffffffffffff48 + in_stack_ffffffffffffff4c;
    height(in_RDI);
    pvVar3 = aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->ref_ = (uint8_t *)((ulong)pvVar3 >> 1);
  }
  else {
    block_size(in_RDI);
    puVar2 = (uint8_t *)
             aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->src_ = puVar2;
    block_size(in_RDI);
    puVar2 = (uint8_t *)
             aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->sec_ = puVar2;
    in_stack_ffffffffffffff50 = block_size(in_RDI);
    in_stack_ffffffffffffff54 = width(in_RDI);
    in_stack_ffffffffffffff54 = in_stack_ffffffffffffff50 + in_stack_ffffffffffffff54;
    height(in_RDI);
    puVar2 = (uint8_t *)
             aom_memalign(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          (size_t)in_stack_ffffffffffffff40);
    in_RDI->ref_ = puVar2;
  }
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0xcc7a6b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI,type,
               (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0xcc7ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc7b4c);
  if (bVar1) {
    local_60 = 0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->data_
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffa8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_RDI);
      in_stack_ffffffffffffff38 =
           (uchar **)testing::AssertionResult::failure_message((AssertionResult *)0xcc7bd3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_RDI,type,
                 (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
      testing::Message::~Message((Message *)0xcc7c21);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc7c9f);
    if (bVar1) {
      testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 &in_stack_ffffffffffffff30->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_RDI);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xcc7d1d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_RDI,type,
                   (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8)
        ;
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xcc7d6b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc7de3);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = this->GetParam();

    rnd_.Reset(ACMRandom::DeterministicSeed());
    if (!use_high_bit_depth()) {
      src_ = reinterpret_cast<uint8_t *>(aom_memalign(32, block_size()));
      sec_ = reinterpret_cast<uint8_t *>(aom_memalign(32, block_size()));
      ref_ = reinterpret_cast<uint8_t *>(
          aom_memalign(32, block_size() + width() + height() + 1));
    } else {
      src_ = CONVERT_TO_BYTEPTR(reinterpret_cast<uint16_t *>(
          aom_memalign(32, block_size() * sizeof(uint16_t))));
      sec_ = CONVERT_TO_BYTEPTR(reinterpret_cast<uint16_t *>(
          aom_memalign(32, block_size() * sizeof(uint16_t))));
      ref_ = CONVERT_TO_BYTEPTR(aom_memalign(
          32, (block_size() + width() + height() + 1) * sizeof(uint16_t)));
    }
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(sec_, nullptr);
    ASSERT_NE(ref_, nullptr);
  }